

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_pipe_recv_cb(void *arg)

{
  nni_msg *pnVar1;
  nni_aio *aio_00;
  nni_aio *aio_01;
  size_t sVar2;
  undefined1 local_58 [8];
  nni_iov iov;
  uint64_t len;
  nni_aio *rxaio;
  nni_msg *msg;
  size_t n;
  int rv;
  nni_aio *aio;
  sfd_tran_pipe *p;
  void *arg_local;
  
  aio_00 = (nni_aio *)((long)arg + 0x268);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  aio_01 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x70));
  n._4_4_ = nni_aio_result(aio_00);
  if (n._4_4_ == NNG_OK) {
    if ((*(byte *)((long)arg + 0x20) & 1) == 0) {
      sVar2 = nni_aio_count(aio_00);
      nni_aio_iov_advance(aio_00,sVar2);
      sVar2 = nni_aio_iov_count(aio_00);
      if (sVar2 != 0) {
        nng_stream_recv(*arg,aio_00);
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
        return;
      }
      if (*(long *)((long)arg + 0x5f8) != 0) {
LAB_0012b876:
        nni_aio_list_remove(aio_01);
        pnVar1 = *(nni_msg **)((long)arg + 0x5f8);
        *(undefined8 *)((long)arg + 0x5f8) = 0;
        sVar2 = nni_msg_len(pnVar1);
        nni_pipe_bump_rx(*(nni_pipe **)((long)arg + 8),sVar2);
        sfd_tran_pipe_recv_start((sfd_tran_pipe *)arg);
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
        nni_aio_set_msg(aio_01,pnVar1);
        nni_aio_finish_sync(aio_01,NNG_OK,sVar2);
        return;
      }
      iov.iov_len = ((ulong)*(byte *)((long)arg + 0x48) << 0x38) +
                    ((ulong)*(byte *)((long)arg + 0x49) << 0x30) +
                    ((ulong)*(byte *)((long)arg + 0x4a) << 0x28) +
                    ((ulong)*(byte *)((long)arg + 0x4b) << 0x20) +
                    (ulong)*(byte *)((long)arg + 0x4c) * 0x1000000 +
                    (ulong)*(byte *)((long)arg + 0x4d) * 0x10000 +
                    (ulong)*(byte *)((long)arg + 0x4e) * 0x100 + (ulong)*(byte *)((long)arg + 0x4f);
      if ((*(ulong *)((long)arg + 0x18) < iov.iov_len) && (*(long *)((long)arg + 0x18) != 0)) {
        n._4_4_ = NNG_EMSGSIZE;
      }
      else {
        n._4_4_ = nni_msg_alloc((nni_msg **)((long)arg + 0x5f8),iov.iov_len);
        if (n._4_4_ == NNG_OK) {
          if (iov.iov_len != 0) {
            local_58 = (undefined1  [8])nni_msg_body(*(nni_msg **)((long)arg + 0x5f8));
            iov.iov_buf = (void *)iov.iov_len;
            nni_aio_set_iov(aio_00,1,(nni_iov *)local_58);
            nng_stream_recv(*arg,aio_00);
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
            return;
          }
          goto LAB_0012b876;
        }
      }
    }
    else {
      n._4_4_ = NNG_ECLOSED;
    }
  }
  nni_aio_list_remove(aio_01);
  pnVar1 = *(nni_msg **)((long)arg + 0x5f8);
  *(undefined8 *)((long)arg + 0x5f8) = 0;
  nni_pipe_bump_error(*(nni_pipe **)((long)arg + 8),n._4_4_);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  nni_msg_free(pnVar1);
  nni_aio_finish_error(aio_01,n._4_4_);
  return;
}

Assistant:

static void
sfd_tran_pipe_recv_cb(void *arg)
{
	sfd_tran_pipe *p = arg;
	nni_aio       *aio;
	int            rv;
	size_t         n;
	nni_msg       *msg;
	nni_aio       *rxaio = &p->rxaio;

	nni_mtx_lock(&p->mtx);
	aio = nni_list_first(&p->recvq);

	if ((rv = nni_aio_result(rxaio)) != 0) {
		goto recv_error;
	}

	if (p->closed) {
		rv = NNG_ECLOSED;
		goto recv_error;
	}

	n = nni_aio_count(rxaio);
	nni_aio_iov_advance(rxaio, n);
	if (nni_aio_iov_count(rxaio) > 0) {
		nng_stream_recv(p->conn, rxaio);
		nni_mtx_unlock(&p->mtx);
		return;
	}

	// If we don't have a message yet, we were reading the message
	// header, which is just the length.  This tells us the size of the
	// message to allocate and how much more to expect.
	if (p->rxmsg == NULL) {
		uint64_t len;
		// We should have gotten a message header.
		NNI_GET64(p->rxlen, len);

		// Make sure the message payload is not too big.  If it is
		// the caller will shut down the pipe.
		if ((len > p->rcvmax) && (p->rcvmax > 0)) {
			rv = NNG_EMSGSIZE;
			goto recv_error;
		}

		if ((rv = nni_msg_alloc(&p->rxmsg, (size_t) len)) != 0) {
			goto recv_error;
		}

		// Submit the rest of the data for a read -- we want to
		// read the entire message now.
		if (len != 0) {
			nni_iov iov;
			iov.iov_buf = nni_msg_body(p->rxmsg);
			iov.iov_len = (size_t) len;

			nni_aio_set_iov(rxaio, 1, &iov);
			nng_stream_recv(p->conn, rxaio);
			nni_mtx_unlock(&p->mtx);
			return;
		}
	}

	// We read a message completely.  Let the user know the good news.
	nni_aio_list_remove(aio);
	msg      = p->rxmsg;
	p->rxmsg = NULL;
	n        = nni_msg_len(msg);

	nni_pipe_bump_rx(p->npipe, n);
	sfd_tran_pipe_recv_start(p);
	nni_mtx_unlock(&p->mtx);

	nni_aio_set_msg(aio, msg);
	nni_aio_finish_sync(aio, 0, n);
	return;

recv_error:
	nni_aio_list_remove(aio);
	msg      = p->rxmsg;
	p->rxmsg = NULL;
	nni_pipe_bump_error(p->npipe, rv);
	// Intentionally, we do not queue up another receive.
	// The protocol should notice this error and close the pipe.
	nni_mtx_unlock(&p->mtx);

	nni_msg_free(msg);
	nni_aio_finish_error(aio, rv);
}